

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall
QTableModel::setHeaderData
          (QTableModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  QTableWidgetItem *pQVar1;
  ulong uVar2;
  QList<QTableWidgetItem_*> *pQVar3;
  
  if (((-1 < section) &&
      ((uVar2 = (ulong)(uint)section, orientation != Horizontal ||
       (uVar2 < (ulong)(this->horizontalHeaderItems).d.size)))) &&
     ((orientation != Vertical || (uVar2 < (ulong)(this->verticalHeaderItems).d.size)))) {
    pQVar3 = &this->horizontalHeaderItems;
    if (orientation != Horizontal) {
      pQVar3 = &this->verticalHeaderItems;
    }
    pQVar1 = (pQVar3->d).ptr[uVar2];
    if (pQVar1 != (QTableWidgetItem *)0x0) {
      (*pQVar1->_vptr_QTableWidgetItem[4])(pQVar1,(ulong)(uint)role,value);
    }
    return pQVar1 != (QTableWidgetItem *)0x0;
  }
  return false;
}

Assistant:

bool QTableModel::setHeaderData(int section, Qt::Orientation orientation,
                                const QVariant &value, int role)
{
    if (section < 0 ||
       (orientation == Qt::Horizontal && horizontalHeaderItems.size() <= section) ||
       (orientation == Qt::Vertical && verticalHeaderItems.size() <= section))
    return false;

    QTableWidgetItem *itm = nullptr;
    if (orientation == Qt::Horizontal)
        itm = horizontalHeaderItems.at(section);
    else
        itm = verticalHeaderItems.at(section);
    if (itm) {
        itm->setData(role, value);
        return true;
    }
    return false;
}